

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCylinderShape.h
# Opt level: O1

void __thiscall cbtCylinderShape::setLocalScaling(cbtCylinderShape *this,cbtVector3 *scaling)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  float in_XMM0_Da;
  float fVar8;
  float fVar9;
  
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])();
  fVar8 = in_XMM0_Da;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  fVar9 = fVar8;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  fVar1 = (this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats[0];
  fVar2 = (this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats[1];
  fVar3 = (this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats[2];
  fVar4 = *(float *)&(this->super_cbtConvexInternalShape).super_cbtConvexShape.
                     super_cbtCollisionShape.field_0x1c;
  fVar5 = *(float *)&(this->super_cbtConvexInternalShape).field_0x20;
  fVar6 = *(float *)&(this->super_cbtConvexInternalShape).field_0x24;
  cbtConvexInternalShape::setLocalScaling(&this->super_cbtConvexInternalShape,scaling);
  auVar7 = vinsertps_avx(ZEXT416((uint)(((in_XMM0_Da + fVar1) / fVar4) *
                                        *(float *)&(this->super_cbtConvexInternalShape).
                                                   super_cbtConvexShape.super_cbtCollisionShape.
                                                   field_0x1c - in_XMM0_Da)),
                         ZEXT416((uint)(((fVar8 + fVar2) / fVar5) *
                                        *(float *)&(this->super_cbtConvexInternalShape).field_0x20 -
                                       fVar8)),0x10);
  auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)(((fVar9 + fVar3) / fVar6) *
                                               *(float *)&(this->super_cbtConvexInternalShape).
                                                          field_0x24 - fVar9)),0x28);
  *(undefined1 (*) [16])(this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats =
       auVar7;
  return;
}

Assistant:

virtual void setLocalScaling(const cbtVector3& scaling)
	{
		cbtVector3 oldMargin(getMargin(), getMargin(), getMargin());
		cbtVector3 implicitShapeDimensionsWithMargin = m_implicitShapeDimensions + oldMargin;
		cbtVector3 unScaledImplicitShapeDimensionsWithMargin = implicitShapeDimensionsWithMargin / m_localScaling;

		cbtConvexInternalShape::setLocalScaling(scaling);

		m_implicitShapeDimensions = (unScaledImplicitShapeDimensionsWithMargin * m_localScaling) - oldMargin;
	}